

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void template_setsymbol(t_template *x,t_symbol *fieldname,t_word *wp,t_symbol *s,int loud)

{
  int iVar1;
  t_symbol *local_40;
  t_symbol *arraytype;
  int local_30;
  int type;
  int onset;
  int loud_local;
  t_symbol *s_local;
  t_word *wp_local;
  t_symbol *fieldname_local;
  t_template *x_local;
  
  type = loud;
  _onset = s;
  s_local = (t_symbol *)wp;
  wp_local = (t_word *)fieldname;
  fieldname_local = (t_symbol *)x;
  iVar1 = template_find_field(x,fieldname,&local_30,(int *)((long)&arraytype + 4),&local_40);
  if (iVar1 == 0) {
    if (type != 0) {
      pd_error((void *)0x0,"%s.%s: no such field",fieldname_local->s_next->s_name,wp_local->w_symbol
              );
    }
  }
  else if (arraytype._4_4_ == 1) {
    *(t_symbol **)((long)&s_local->s_name + (long)local_30) = _onset;
  }
  else if (type != 0) {
    pd_error((void *)0x0,"%s.%s: not a symbol",fieldname_local->s_next->s_name,wp_local->w_symbol);
  }
  return;
}

Assistant:

void template_setsymbol(t_template *x, t_symbol *fieldname, t_word *wp,
    t_symbol *s, int loud)
{
    int onset, type;
    t_symbol *arraytype;
    if (template_find_field(x, fieldname, &onset, &type, &arraytype))
     {
        if (type == DT_SYMBOL)
            *(t_symbol **)(((char *)wp) + onset) = s;
        else if (loud) pd_error(0, "%s.%s: not a symbol",
            x->t_sym->s_name, fieldname->s_name);
    }
    else if (loud) pd_error(0, "%s.%s: no such field",
        x->t_sym->s_name, fieldname->s_name);
}